

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.cpp
# Opt level: O3

void __thiscall icu_63::Norms::enumRanges(Norms *this,Enumerator *e)

{
  uint uVar1;
  ulong uVar2;
  uint32_t i;
  uint32_t local_2c;
  
  uVar2 = 0;
  for (uVar1 = umutablecptrie_getRange_63
                         (this->normTrie,0,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                          (void *)0x0,&local_2c); -1 < (int)uVar1;
      uVar1 = umutablecptrie_getRange_63
                        (this->normTrie,uVar1 + 1,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                         (void *)0x0,&local_2c)) {
    if (local_2c != 0) {
      (*e->_vptr_Enumerator[2])(e,uVar2,(ulong)uVar1);
    }
    uVar2 = (ulong)(uVar1 + 1);
  }
  return;
}

Assistant:

void Norms::enumRanges(Enumerator &e) {
    UChar32 start = 0, end;
    uint32_t i;
    while ((end = umutablecptrie_getRange(normTrie, start, UCPMAP_RANGE_NORMAL, 0,
                                          nullptr, nullptr, &i)) >= 0) {
        if (i > 0) {
            e.rangeHandler(start, end, norms[i]);
        }
        start = end + 1;
    }
}